

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O2

int f(sunrealtype t,N_Vector u,N_Vector udot,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  
  lVar14 = N_VGetArrayPointer();
  lVar15 = N_VGetArrayPointer();
  dVar25 = sin(t * *(double *)((long)user_data + 0x968));
  dVar31 = 0.0;
  dVar30 = 0.0;
  if (0.0 < dVar25) {
    dVar30 = exp(-22.62 / dVar25);
    dVar31 = exp(-7.601 / dVar25);
    dVar30 = dVar30 * 3.7e+16;
  }
  *(double *)((long)user_data + 0x960) = dVar31;
  dVar25 = *(double *)((long)user_data + 0x978);
  dVar3 = *(double *)((long)user_data + 0x980);
  dVar4 = *(double *)((long)user_data + 0x990);
  dVar5 = *(double *)((long)user_data + 0x988);
  lVar1 = lVar14 + 8;
  lVar15 = lVar15 + 8;
  lVar24 = lVar1;
  for (lVar18 = 0; lVar18 != 10; lVar18 = lVar18 + 1) {
    dVar26 = ((double)(int)lVar18 + -0.5) * dVar25 + 30.0;
    dVar27 = exp(dVar26 * 0.2);
    dVar26 = exp((dVar25 + dVar26) * 0.2);
    dVar26 = dVar26 * dVar4;
    lVar16 = 0xffffffff;
    if (lVar18 == 0) {
      lVar16 = 1;
    }
    lVar17 = 1;
    if (lVar18 == 9) {
      lVar17 = 0xffffffff;
    }
    dVar27 = dVar27 * -dVar4;
    lVar2 = lVar14 + lVar18 * 0xa0;
    lVar19 = lVar18 * 0xa0 + lVar14 + 8;
    lVar17 = ((lVar17 + lVar18) * 0x1400000000 >> 0x1d) + lVar1;
    lVar16 = ((lVar16 + lVar18) * 0x1400000000 >> 0x1d) + lVar1;
    iVar20 = 0;
    for (lVar21 = 0; lVar21 != 0xa0; lVar21 = lVar21 + 0x10) {
      dVar6 = *(double *)(lVar24 + -8 + lVar21);
      dVar7 = *(double *)(lVar24 + lVar21);
      dVar28 = dVar6 * 1.63e-16 * 3.7e+16;
      dVar29 = dVar6 * 4.66e-16 * dVar7;
      dVar8 = *(double *)(lVar17 + lVar21);
      dVar9 = *(double *)(lVar16 + lVar21);
      lVar22 = (long)(int)(((-(uint)(lVar21 != 0) | 1) + iVar20) * 2);
      dVar10 = *(double *)(lVar2 + lVar22 * 8);
      lVar23 = (long)(int)((iVar20 + (uint)(lVar21 != 0x90) * 2) * 2 + -2);
      dVar11 = *(double *)(lVar2 + lVar23 * 8);
      dVar12 = *(double *)(lVar19 + lVar23 * 8);
      dVar13 = *(double *)(lVar19 + lVar22 * 8);
      *(double *)(lVar15 + -8 + lVar21) =
           (dVar11 - dVar10) * dVar5 +
           ((dVar11 - (dVar6 + dVar6)) + dVar10) * dVar3 +
           (*(double *)(lVar17 + -8 + lVar21) - dVar6) * dVar26 +
           (dVar6 - *(double *)(lVar16 + -8 + lVar21)) * dVar27 +
           dVar30 + dVar30 + (-dVar28 - dVar29) + dVar31 * dVar7;
      *(double *)(lVar15 + lVar21) =
           (dVar12 - dVar13) * dVar5 +
           ((dVar12 - (dVar7 + dVar7)) + dVar13) * dVar3 +
           (dVar8 - dVar7) * dVar26 + (dVar7 - dVar9) * dVar27 +
           ((dVar28 - dVar29) - dVar31 * dVar7);
      iVar20 = iVar20 + 1;
    }
    lVar15 = lVar15 + 0xa0;
    lVar24 = lVar24 + 0xa0;
  }
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector u, N_Vector udot, void* user_data)
{
  sunrealtype q3, c1, c2, c1dn, c2dn, c1up, c2up, c1lt, c2lt;
  sunrealtype c1rt, c2rt, cydn, cyup, hord1, hord2, horad1, horad2;
  sunrealtype qq1, qq2, qq3, qq4, rkin1, rkin2, s, vertd1, vertd2, ydn, yup;
  sunrealtype q4coef, dely, verdco, hordco, horaco;
  sunrealtype *udata, *dudata;
  int jx, jy, idn, iup, ileft, iright;
  UserData data;

  data   = (UserData)user_data;
  udata  = N_VGetArrayPointer(u);
  dudata = N_VGetArrayPointer(udot);

  /* Set diurnal rate coefficients. */

  s = sin(data->om * t);
  if (s > ZERO)
  {
    q3       = exp(-A3 / s);
    data->q4 = exp(-A4 / s);
  }
  else
  {
    q3       = ZERO;
    data->q4 = ZERO;
  }

  /* Make local copies of problem variables, for efficiency. */

  q4coef = data->q4;
  dely   = data->dy;
  verdco = data->vdco;
  hordco = data->hdco;
  horaco = data->haco;

  /* Loop over all grid points. */

  for (jy = 0; jy < MY; jy++)
  {
    /* Set vertical diffusion coefficients at jy +- 1/2 */

    ydn  = YMIN + (jy - SUN_RCONST(0.5)) * dely;
    yup  = ydn + dely;
    cydn = verdco * exp(SUN_RCONST(0.2) * ydn);
    cyup = verdco * exp(SUN_RCONST(0.2) * yup);
    idn  = (jy == 0) ? 1 : -1;
    iup  = (jy == MY - 1) ? -1 : 1;
    for (jx = 0; jx < MX; jx++)
    {
      /* Extract c1 and c2, and set kinetic rate terms. */

      c1    = IJKth(udata, 1, jx, jy);
      c2    = IJKth(udata, 2, jx, jy);
      qq1   = Q1 * c1 * C3;
      qq2   = Q2 * c1 * c2;
      qq3   = q3 * C3;
      qq4   = q4coef * c2;
      rkin1 = -qq1 - qq2 + TWO * qq3 + qq4;
      rkin2 = qq1 - qq2 - qq4;

      /* Set vertical diffusion terms. */

      c1dn   = IJKth(udata, 1, jx, jy + idn);
      c2dn   = IJKth(udata, 2, jx, jy + idn);
      c1up   = IJKth(udata, 1, jx, jy + iup);
      c2up   = IJKth(udata, 2, jx, jy + iup);
      vertd1 = cyup * (c1up - c1) - cydn * (c1 - c1dn);
      vertd2 = cyup * (c2up - c2) - cydn * (c2 - c2dn);

      /* Set horizontal diffusion and advection terms. */

      ileft  = (jx == 0) ? 1 : -1;
      iright = (jx == MX - 1) ? -1 : 1;
      c1lt   = IJKth(udata, 1, jx + ileft, jy);
      c2lt   = IJKth(udata, 2, jx + ileft, jy);
      c1rt   = IJKth(udata, 1, jx + iright, jy);
      c2rt   = IJKth(udata, 2, jx + iright, jy);
      hord1  = hordco * (c1rt - TWO * c1 + c1lt);
      hord2  = hordco * (c2rt - TWO * c2 + c2lt);
      horad1 = horaco * (c1rt - c1lt);
      horad2 = horaco * (c2rt - c2lt);

      /* Load all terms into udot. */

      IJKth(dudata, 1, jx, jy) = vertd1 + hord1 + horad1 + rkin1;
      IJKth(dudata, 2, jx, jy) = vertd2 + hord2 + horad2 + rkin2;
    }
  }

  return (0);
}